

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O3

int Gia_ManCountTents(Gia_Man_t *p)

{
  bool bVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  Vec_Int_t *pVVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  
  if (p->vCos->nSize <= p->nRegs) {
    __assert_fail("Gia_ManPoNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcS.c"
                  ,0x113,"int Gia_ManCountTents(Gia_Man_t *)");
  }
  Gia_ManIncrementTravId(p);
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
  }
  *p->pTravIds = p->nTravIds;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(400);
  p_00->pArray = piVar3;
  pVVar4 = p->vCos;
  uVar5 = (ulong)(uint)pVVar4->nSize;
  if (p->nRegs < pVVar4->nSize) {
    lVar8 = 0;
    do {
      if ((int)uVar5 <= lVar8) {
LAB_0057cc49:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = pVVar4->pArray[lVar8];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(p_00,iVar6 - (*(uint *)(p->pObjs + iVar6) & 0x1fffffff));
      lVar8 = lVar8 + 1;
      pVVar4 = p->vCos;
      uVar5 = (ulong)pVVar4->nSize;
    } while (lVar8 < (long)(uVar5 - (long)p->nRegs));
    if (0 < p_00->nSize) {
      iVar6 = 0;
      uVar5 = 0;
      uVar2 = p_00->nSize;
      do {
        uVar7 = uVar5;
        do {
          if (((int)uVar5 < 0) || (p_00->nSize <= (int)uVar7)) goto LAB_0057cc49;
          Gia_ManCountTents_rec(p,p_00->pArray[uVar7],p_00);
          uVar7 = uVar7 + 1;
        } while ((int)uVar7 < (int)uVar2);
        iVar6 = iVar6 + 1;
        bVar1 = (int)uVar2 < p_00->nSize;
        uVar5 = (ulong)uVar2;
        uVar2 = p_00->nSize;
      } while (bVar1);
      goto LAB_0057cc22;
    }
  }
  iVar6 = 0;
LAB_0057cc22:
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return iVar6;
}

Assistant:

int Gia_ManCountTents( Gia_Man_t * p )
{
    Vec_Int_t * vRoots;
    Gia_Obj_t * pObj;  
    int t, i, iObj, nSizeCurr = 0;
    assert( Gia_ManPoNum(p) > 0 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    vRoots = Vec_IntAlloc( 100 );
    Gia_ManForEachPo( p, pObj, i )
        Vec_IntPush( vRoots, Gia_ObjFaninId0p(p, pObj) );
    for ( t = 0; nSizeCurr < Vec_IntSize(vRoots); t++ )
    {
        int nSizePrev = nSizeCurr;
        nSizeCurr = Vec_IntSize(vRoots);
        Vec_IntForEachEntryStartStop( vRoots, iObj, i, nSizePrev, nSizeCurr )
            Gia_ManCountTents_rec( p, iObj, vRoots );
    }
    Vec_IntFree( vRoots );
    return t;
}